

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall mp3_encoder::Encoder::~Encoder(Encoder *this)

{
  if (this->m_lameFlags != (lame_global_flags *)0x0) {
    lame_close();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_mp3Buffer).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_wavBuffer).super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&this->m_wavFilePath);
  return;
}

Assistant:

Encoder::~Encoder()
    {
        if (m_lameFlags)
        {
            lame_close(m_lameFlags);
        }
    }